

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O2

UBool isWhitespace(UChar32 c)

{
  if (c != 9) {
    if (c != 10) {
      if (c == 0xd) {
        return '\x01';
      }
      if (c == 0x20) {
        return '\x01';
      }
      if (c == 0xfeff) {
        return '\x01';
      }
      if (c != 0x2029) {
        return '\0';
      }
    }
    lineCount = lineCount + 1;
  }
  return '\x01';
}

Assistant:

static UBool isWhitespace(UChar32 c) {
    switch (c) {
        /* ' ', '\t', '\n', '\r', 0x2029, 0xFEFF */
    case 0x000A:
    case 0x2029:
        lineCount++;
    case 0x000D:
    case 0x0020:
    case 0x0009:
    case 0xFEFF:
        return TRUE;

    default:
        return FALSE;
    }
}